

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_202012.hpp
# Opt level: O1

string * jsoncons::jsonschema::draft202012::
         schema_validator_factory_202012<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
         ::validation_id_abi_cxx11_(void)

{
  int iVar1;
  
  if (validation_id[abi:cxx11]()::id_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&validation_id[abi:cxx11]()::id_abi_cxx11_);
    if (iVar1 != 0) {
      validation_id[abi:cxx11]()::id_abi_cxx11_._M_dataplus._M_p =
           (pointer)&validation_id[abi:cxx11]()::id_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&validation_id[abi:cxx11]()::id_abi_cxx11_,
                 "https://json-schema.org/draft/2020-12/vocab/validation","");
      __cxa_atexit(std::__cxx11::string::~string,&validation_id[abi:cxx11]()::id_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&validation_id[abi:cxx11]()::id_abi_cxx11_);
    }
  }
  return &validation_id[abi:cxx11]()::id_abi_cxx11_;
}

Assistant:

static const std::string& validation_id()
        {
            static std::string id = "https://json-schema.org/draft/2020-12/vocab/validation";
            return id;
        }